

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLinearAllocator.hpp
# Opt level: O1

void * __thiscall
Diligent::DynamicLinearAllocator::Allocate(DynamicLinearAllocator *this,size_t size,size_t align)

{
  pointer pBVar1;
  DynamicLinearAllocator *this_00;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  undefined4 extraout_var;
  uint8_t *puVar5;
  pointer pBVar6;
  char (*in_R8) [23];
  char (*Args_2) [23];
  bool bVar7;
  string msg;
  size_t local_78;
  string local_70;
  size_t local_50;
  DynamicLinearAllocator *local_48;
  void *local_40;
  ulong local_38;
  
  if (size == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pBVar6 = (this->m_Blocks).
             super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (this->m_Blocks).
             super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar7 = pBVar6 == pBVar1;
    local_50 = size;
    local_48 = this;
    if (!bVar7) {
      uVar3 = align - (align >> 1 & 0x5555555555555555);
      uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
      do {
        puVar5 = pBVar6->CurrPtr;
        local_78 = align;
        if ((char)(((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) != '\x01'
           ) {
          FormatString<char[12],unsigned_long,char[23]>
                    (&local_70,(Diligent *)"Alignment (",(char (*) [12])&local_78,
                     (unsigned_long *)") must be a power of 2",in_R8);
          DebugAssertionFailed
                    (local_70._M_dataplus._M_p,"AlignUp",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                     ,0x34);
          size = local_50;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            size = local_50;
          }
        }
        pvVar4 = (void *)(-local_78 & (ulong)(puVar5 + (local_78 - 1)));
        puVar5 = (uint8_t *)((long)pvVar4 + size);
        if (puVar5 <= pBVar6->Data + pBVar6->Size) {
          pBVar6->CurrPtr = puVar5;
          local_40 = pvVar4;
          break;
        }
        pBVar6 = pBVar6 + 1;
        bVar7 = pBVar6 == pBVar1;
      } while (!bVar7);
    }
    this_00 = local_48;
    pvVar4 = local_40;
    if (bVar7) {
      uVar3 = (ulong)local_48->m_BlockSize;
      do {
        local_38 = uVar3;
        uVar3 = local_38 * 2;
      } while (local_38 < (size + align) - 1);
      Args_2 = (char (*) [23])0x6a;
      iVar2 = (**local_48->m_pAllocator->_vptr_IMemoryAllocator)
                        (local_48->m_pAllocator,local_38,"dynamic linear allocator page",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/DynamicLinearAllocator.hpp"
                        );
      local_70._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar2);
      std::
      vector<Diligent::DynamicLinearAllocator::Block,std::allocator<Diligent::DynamicLinearAllocator::Block>>
      ::emplace_back<void*,unsigned_long&>
                ((vector<Diligent::DynamicLinearAllocator::Block,std::allocator<Diligent::DynamicLinearAllocator::Block>>
                  *)this_00,(void **)&local_70,&local_38);
      pBVar6 = (this_00->m_Blocks).
               super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar5 = pBVar6[-1].Data;
      local_78 = align;
      if ((align ^ align - 1) <= align - 1) {
        FormatString<char[12],unsigned_long,char[23]>
                  (&local_70,(Diligent *)"Alignment (",(char (*) [12])&local_78,
                   (unsigned_long *)") must be a power of 2",Args_2);
        DebugAssertionFailed
                  (local_70._M_dataplus._M_p,"AlignUp",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                   ,0x34);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      pvVar4 = (void *)(-local_78 & (ulong)(puVar5 + (local_78 - 1)));
      puVar5 = (uint8_t *)(local_50 + (long)pvVar4);
      if (pBVar6[-1].Data + pBVar6[-1].Size < puVar5) {
        FormatString<char[50]>
                  (&local_70,(char (*) [50])"Not enough space in the new block - this is a bug");
        DebugAssertionFailed
                  (local_70._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/DynamicLinearAllocator.hpp"
                   ,0x6e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      pBVar6[-1].CurrPtr = puVar5;
    }
  }
  return pvVar4;
}

Assistant:

NODISCARD void* Allocate(size_t size, size_t align)
    {
        if (size == 0)
            return nullptr;

        for (auto& block : m_Blocks)
        {
            auto* Ptr = AlignUp(block.CurrPtr, align);
            if (Ptr + size <= block.Data + block.Size)
            {
                block.CurrPtr = Ptr + size;
                return Ptr;
            }
        }

        // Create a new block
        size_t BlockSize = m_BlockSize;
        while (BlockSize < size + align - 1)
            BlockSize *= 2;
        m_Blocks.emplace_back(m_pAllocator->Allocate(BlockSize, "dynamic linear allocator page", __FILE__, __LINE__), BlockSize);

        auto& block = m_Blocks.back();
        auto* Ptr   = AlignUp(block.Data, align);
        VERIFY(Ptr + size <= block.Data + block.Size, "Not enough space in the new block - this is a bug");
        block.CurrPtr = Ptr + size;
        return Ptr;
    }